

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int *piVar6;
  _func_int **pp_Var7;
  long in_RSI;
  long *__s;
  string dir;
  Status local_78;
  Slice local_70;
  char local_60 [16];
  string local_50;
  
  __s = *(long **)(in_RSI + 8);
  pcVar4 = strrchr((char *)__s,0x2f);
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,0x122a16);
  }
  else {
    local_70.data_ = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,pcVar4);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if (local_70.data_ != local_60) {
      operator_delete(local_70.data_);
    }
    __s = (long *)(pcVar4 + 1);
  }
  sVar5 = strlen((char *)__s);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  if ((7 < sVar5) && (*__s == 0x54534546494e414d)) {
    iVar2 = open(local_50._M_dataplus._M_p,0);
    if (iVar2 < 0) {
      piVar6 = __errno_location();
      IOError((anon_unknown_1 *)&local_70,&local_50,*piVar6);
      if (local_70.data_ != (char *)0x0) {
        pp_Var7 = (_func_int **)Status::CopyState(local_70.data_);
        (this->super_WritableFile)._vptr_WritableFile = pp_Var7;
      }
      if (local_70.data_ != (char *)0x0) {
        operator_delete__(local_70.data_);
      }
    }
    else {
      iVar3 = fsync(iVar2);
      if (iVar3 < 0) {
        piVar6 = __errno_location();
        IOError((anon_unknown_1 *)&local_70,&local_50,*piVar6);
        if (local_70.data_ != (char *)0x0) {
          pp_Var7 = (_func_int **)Status::CopyState(local_70.data_);
          (this->super_WritableFile)._vptr_WritableFile = pp_Var7;
        }
        if (local_70.data_ != (char *)0x0) {
          operator_delete__(local_70.data_);
        }
      }
      close(iVar2);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((this->super_WritableFile)._vptr_WritableFile == (_func_int **)0x0) {
    iVar2 = fflush_unlocked(*(FILE **)(in_RSI + 0x28));
    if (iVar2 == 0) {
      iVar2 = fileno(*(FILE **)(in_RSI + 0x28));
      iVar2 = fdatasync(iVar2);
      if (iVar2 == 0) {
        return (Status)(char *)this;
      }
    }
    local_50._M_dataplus._M_p = *(pointer *)(in_RSI + 8);
    local_50._M_string_length = *(size_type *)(in_RSI + 0x10);
    piVar6 = __errno_location();
    local_70.data_ = strerror(*piVar6);
    local_70.size_ = strlen(local_70.data_);
    Status::Status(&local_78,kIOError,(Slice *)&local_50,&local_70);
    if (local_78.state_ != (char *)0x0) {
      if (local_78.state_ == (char *)0x0) {
        pp_Var7 = (_func_int **)0x0;
      }
      else {
        pp_Var7 = (_func_int **)Status::CopyState(local_78.state_);
      }
      (this->super_WritableFile)._vptr_WritableFile = pp_Var7;
    }
    if (local_78.state_ != (char *)0x0) {
      operator_delete__(local_78.state_);
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Sync() {
                // Ensure new files referred to by the manifest are in the filesystem.
                Status s = SyncDirIfManifest();
                if (!s.ok()) {
                    return s;
                }
                if (fflush_unlocked(file_) != 0 ||
                    fdatasync(fileno(file_)) != 0) {
                    s = Status::IOError(filename_, strerror(errno));
                }
                return s;
            }